

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O0

void __thiscall HTML::EM::EM(EM *this,ostream *stream)

{
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *stream_local;
  EM *this_local;
  
  local_18 = stream;
  stream_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EM",&local_39);
  TAG::TAG(&this->super_TAG,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_TAG)._vptr_TAG = (_func_int **)&PTR__EM_0030c038;
  return;
}

Assistant:

EM( std::ostream& stream )
  : TAG( "EM", stream ) {}